

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O2

int ddWindowConv3(DdManager *table,int low,int high)

{
  uint uVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  void *__ptr;
  ulong uVar6;
  int iVar7;
  long lStack_50;
  
  iVar7 = high - low;
  if (iVar7 < 2) {
    iVar7 = ddWindowConv2(table,low,high);
    return iVar7;
  }
  uVar1 = iVar7 - 1;
  __ptr = malloc((ulong)uVar1 * 4);
  if (__ptr == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_00634940:
    iVar7 = 0;
  }
  else {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)((long)__ptr + uVar6 * 4) = 1;
    }
    uVar6 = 0;
    bVar4 = false;
    do {
      for (; bVar3 = bVar4, uVar6 != uVar1; uVar6 = uVar6 + 1) {
        if (*(int *)((long)__ptr + uVar6 * 4) != 0) {
          iVar5 = ddPermuteWindow3(table,low + (int)uVar6);
          if (5 < iVar5 - 1U) {
            free(__ptr);
            goto LAB_00634940;
          }
          puVar2 = (undefined4 *)((long)__ptr + uVar6 * 4);
          switch(iVar5) {
          case 1:
            break;
          case 2:
            if ((long)uVar6 < (long)(iVar7 + -2)) {
              puVar2[1] = 1;
            }
            lStack_50 = -8;
            bVar3 = true;
            if (1 < uVar6) {
LAB_006348de:
              bVar3 = true;
              *(undefined4 *)((long)puVar2 + lStack_50) = 1;
            }
            break;
          default:
            if ((long)uVar6 < (long)(iVar7 + -3)) {
              puVar2[2] = 1;
            }
            if ((long)uVar6 < (long)(iVar7 + -2)) {
              puVar2[1] = 1;
            }
            bVar3 = true;
            if (uVar6 != 0) {
              puVar2[-1] = 1;
              lStack_50 = -8;
              if (uVar6 != 1) goto LAB_006348de;
            }
            break;
          case 6:
            if ((long)uVar6 < (long)(iVar7 + -3)) {
              puVar2[2] = 1;
            }
            lStack_50 = -4;
            bVar3 = true;
            if (uVar6 != 0) goto LAB_006348de;
          }
          *puVar2 = 0;
        }
        bVar4 = bVar3;
      }
      uVar6 = 0;
      bVar4 = false;
    } while (bVar3);
    free(__ptr);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int
ddWindowConv3(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 2) return(ddWindowConv2(table,low,high));

    nwin = high-low-1;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                res = ddPermuteWindow3(table,x+low);
                switch (res) {
                case ABC:
                    break;
                case BAC:
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case BCA:
                case CBA:
                case CAB:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case ACB:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                    break;
                default:
                    ABC_FREE(events);
                    return(0);
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res == ABC) {
                    (void) fprintf(table->out,"=");
                } else {
                    (void) fprintf(table->out,"-");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}